

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

string * __thiscall
tinyobj::parseString_abi_cxx11_(string *__return_storage_ptr__,tinyobj *this,char **token)

{
  char *__beg;
  size_t sVar1;
  char *__end;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_t local_28;
  size_t e;
  tinyobj *local_18;
  char **token_local;
  string *s;
  
  e._7_1_ = 0;
  local_18 = this;
  token_local = (char **)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = strspn(*(char **)local_18," \t");
  *(size_t *)local_18 = *(long *)local_18 + sVar1;
  local_28 = strcspn(*(char **)local_18," \t\r");
  __beg = *(char **)local_18;
  __end = __beg + local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>((string *)&local_48,__beg,__end,&local_49);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (__return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  *(size_t *)local_18 = local_28 + *(long *)local_18;
  return __return_storage_ptr__;
}

Assistant:

static inline std::string parseString(const char **token) {
  std::string s;
  (*token) += strspn((*token), " \t");
  size_t e = strcspn((*token), " \t\r");
  s = std::string((*token), &(*token)[e]);
  (*token) += e;
  return s;
}